

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

int Zyx_TestReadNode(char *pLine,Vec_Wrd_t *vTruths,int nVars,int nLutSize,int iObj)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  word *__s;
  word *__s_00;
  word *pFaninsW [6];
  size_t local_78;
  ulong local_70;
  long alStack_68 [7];
  
  bVar8 = (char)nVars - 6;
  uVar3 = 1 << (bVar8 & 0x1f);
  if (nVars < 7) {
    uVar3 = 1;
  }
  bVar11 = 0;
  if (6 < nVars) {
    bVar11 = bVar8;
  }
  iVar4 = vTruths->nSize / (int)uVar3 + -1;
  uVar5 = iVar4 << (bVar11 & 0x1f);
  if ((-1 < iVar4 << (bVar11 & 0x1f)) && ((int)uVar5 < vTruths->nSize)) {
    __s_00 = vTruths->pArray + uVar5;
    sVar6 = strlen(pLine);
    if (pLine[sVar6 - 1] == '\n') {
      pLine[sVar6 - 1] = '\0';
    }
    sVar6 = strlen(pLine);
    if (pLine[sVar6 - 1] == '\r') {
      pLine[sVar6 - 1] = '\0';
    }
    cVar1 = *pLine;
    if (cVar1 == '\0') {
      iVar4 = 0;
    }
    else {
      sVar6 = strlen(pLine);
      uVar5 = 1 << ((byte)nLutSize & 0x1f);
      uVar14 = (ulong)uVar5;
      if (nLutSize + uVar5 + 1 == (int)sVar6) {
        if (iObj + 0x41 == (int)cVar1) {
          if (0 < nLutSize) {
            uVar9 = (ulong)(uint)nLutSize + 1;
            do {
              uVar13 = (uint)(pLine[uVar9 + (long)(int)uVar5 + -1] < 0x61) * 0x20 +
                       (int)pLine[uVar9 + (long)(int)uVar5 + -1] + -0x61 << (bVar11 & 0x1f);
              if (((int)uVar13 < 0) || (vTruths->nSize <= (int)uVar13)) goto LAB_005b274e;
              (&local_78)[uVar9] = (size_t)(vTruths->pArray + uVar13);
              uVar9 = uVar9 - 1;
            } while (1 < uVar9);
          }
          uVar13 = iObj << (bVar11 & 0x1f);
          if ((iObj << (bVar11 & 0x1f) < 0) || (vTruths->nSize <= (int)uVar13)) goto LAB_005b274e;
          __s = vTruths->pArray + uVar13;
          uVar9 = (ulong)uVar3;
          if (0 < (int)uVar3) {
            memset(__s,0,uVar9 * 8);
          }
          iVar4 = 1;
          if (nLutSize != 0x1f) {
            local_78 = uVar9 * 8;
            uVar15 = 1;
            if (1 < (int)uVar5) {
              uVar15 = (ulong)uVar5;
            }
            uVar12 = 0;
            local_70 = uVar14;
            do {
              if (pLine[(long)(int)(~(uint)uVar12 + (int)uVar14) + 1] != '0') {
                if (0 < (int)uVar3) {
                  memset(__s_00,0xff,local_78);
                  uVar14 = local_70;
                }
                if (0 < nLutSize) {
                  uVar7 = 0;
                  do {
                    lVar2 = alStack_68[uVar7];
                    if (((uint)uVar12 >> ((uint)uVar7 & 0x1f) & 1) == 0) {
                      if (0 < (int)uVar3) {
                        uVar10 = 0;
                        do {
                          __s_00[uVar10] = __s_00[uVar10] & ~*(ulong *)(lVar2 + uVar10 * 8);
                          uVar10 = uVar10 + 1;
                        } while (uVar9 != uVar10);
                      }
                    }
                    else if (0 < (int)uVar3) {
                      uVar10 = 0;
                      do {
                        __s_00[uVar10] = __s_00[uVar10] & *(ulong *)(lVar2 + uVar10 * 8);
                        uVar10 = uVar10 + 1;
                      } while (uVar9 != uVar10);
                    }
                    uVar7 = uVar7 + 1;
                  } while (uVar7 != (uint)nLutSize);
                }
                if (0 < (int)uVar3) {
                  uVar7 = 0;
                  do {
                    __s[uVar7] = __s[uVar7] | __s_00[uVar7];
                    uVar7 = uVar7 + 1;
                  } while (uVar9 != uVar7);
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar15);
            iVar4 = 1;
          }
        }
        else {
          iVar4 = 0;
          printf("The output node in line %s is not correct.\n",pLine);
        }
      }
      else {
        iVar4 = 0;
        printf("Node representation has %d chars (expecting %d chars).\n",sVar6 & 0xffffffff);
      }
    }
    return iVar4;
  }
LAB_005b274e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

int Zyx_TestReadNode( char * pLine, Vec_Wrd_t * vTruths, int nVars, int nLutSize, int iObj )
{
    int k, j, nWords = Abc_TtWordNum(nVars);
    word * pFaninsW[6]; char * pTruth, * pFanins;
    word * pThis, * pLast = Zyx_TestTruth( vTruths, Vec_WrdSize(vTruths)/nWords - 1, nWords );
    if ( pLine[strlen(pLine)-1] == '\n' ) pLine[strlen(pLine)-1] = 0;
    if ( pLine[strlen(pLine)-1] == '\r' ) pLine[strlen(pLine)-1] = 0;
    if ( pLine[0] == 0 )
        return 0;
    if ( (int)strlen(pLine) != 1 + nLutSize + (1 << nLutSize) )
    {
        printf( "Node representation has %d chars (expecting %d chars).\n", (int)strlen(pLine), 1 + nLutSize + (1 << nLutSize) );
        return 0;
    }
    if ( pLine[0] != 'A' + iObj )
    {
        printf( "The output node in line %s is not correct.\n", pLine );
        return 0;
    }
    pTruth  = pLine + 1;
    pFanins = pTruth + (1 << nLutSize);
    for ( k = nLutSize - 1; k >= 0; k-- )
        pFaninsW[k] = Zyx_TestTruth( vTruths, pFanins[k] >= 'a' ? pFanins[k] - 'a' : pFanins[k] - 'A', nWords );
    pThis = Zyx_TestTruth(vTruths, iObj, nWords);
    Abc_TtConst0( pThis, nWords );
    for ( k = 0; k < (1 << nLutSize); k++ )
    {
        if ( pTruth[(1 << nLutSize) - 1 - k] == '0' )
            continue;
        Abc_TtConst1( pLast, nWords );
        for ( j = 0; j < nLutSize; j++ )
            Abc_TtAndCompl( pLast, pLast, 0, pFaninsW[j], !((k >> j) & 1), nWords );
        Abc_TtOr( pThis, pThis, pLast, nWords );
    }
    //Dau_DsdPrintFromTruth( pThis, nVars );
    return 1;
}